

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_subcommands_abi_cxx11_(Formatter *this,App *app,AppFormatMode mode)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  reference ppAVar5;
  ulong uVar6;
  string *psVar7;
  int in_ECX;
  long *in_RSI;
  string *in_RDI;
  App *new_com;
  iterator __end2;
  iterator __begin2;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range2;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands_group;
  string *group;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string group_key;
  App *com;
  iterator __end1;
  iterator __begin1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  stringstream out;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *in_stack_fffffffffffffc08;
  function<bool_(const_CLI::App_*)> *in_stack_fffffffffffffc10;
  App *in_stack_fffffffffffffc18;
  App *this_00;
  function<bool_(const_CLI::App_*)> *in_stack_fffffffffffffc20;
  anon_class_8_1_bd38f33f_for__M_pred in_stack_fffffffffffffc28;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffc30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffc38;
  bool local_3a1;
  string local_370 [32];
  string local_350 [28];
  AppFormatMode in_stack_fffffffffffffccc;
  string *in_stack_fffffffffffffcd0;
  App *in_stack_fffffffffffffcd8;
  App *in_stack_fffffffffffffcf0;
  iterator in_stack_fffffffffffffcf8;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  local_300;
  undefined1 *local_2f8;
  reference local_2f0;
  undefined1 local_2c8 [24];
  reference local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a0;
  undefined1 *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  string *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  string local_268 [32];
  string local_248 [32];
  App *local_228;
  App **local_220;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  local_218;
  undefined1 *local_210;
  undefined1 local_208 [72];
  undefined1 local_1c0 [24];
  stringstream local_1a8 [16];
  function<bool_(const_CLI::App_*)> local_198 [11];
  int local_1c;
  
  local_1c = in_ECX;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  std::function<bool_(const_CLI::App_*)>::function(in_stack_fffffffffffffc10);
  App::get_subcommands
            ((App *)in_stack_fffffffffffffcf8._M_current,
             (function<bool_(const_CLI::App_*)> *)in_stack_fffffffffffffcf0);
  std::function<bool_(const_CLI::App_*)>::~function((function<bool_(const_CLI::App_*)> *)0x12b8c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12b8d5);
  local_210 = local_1c0;
  local_218._M_current =
       (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                         (in_stack_fffffffffffffc08);
  local_220 = (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                                (in_stack_fffffffffffffc08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                             *)in_stack_fffffffffffffc10,
                            (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                             *)in_stack_fffffffffffffc08), bVar1) {
    ppAVar5 = __gnu_cxx::
              __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
              ::operator*(&local_218);
    local_228 = *ppAVar5;
    App::get_name_abi_cxx11_(local_228);
    uVar6 = ::std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      psVar7 = App::get_group_abi_cxx11_(local_228);
      ::std::__cxx11::string::string(local_268,(string *)psVar7);
      uVar2 = ::std::__cxx11::string::empty();
      local_3a1 = false;
      if ((uVar2 & 1) == 0) {
        local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffc08);
        local_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffc08);
        local_288 = local_268;
        local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::std::
                    find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_subcommands(CLI::App_const*,CLI::AppFormatMode)const::_lambda(std::__cxx11::string)_1_>
                              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                               in_stack_fffffffffffffc28);
        local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffc08);
        local_3a1 = __gnu_cxx::operator==
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffffc10,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffffc08);
      }
      if (local_3a1 != false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
      }
      ::std::__cxx11::string::~string(local_268);
    }
    else {
      App::get_group_abi_cxx11_(local_228);
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        App::get_group_abi_cxx11_(local_228);
        pcVar3 = (char *)::std::__cxx11::string::front();
        if (*pcVar3 != '+') {
          (**(code **)(*in_RSI + 0x38))(local_248,in_RSI,local_228,local_1c);
          ::std::operator<<((ostream *)local_198,local_248);
          ::std::__cxx11::string::~string(local_248);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
    ::operator++(&local_218);
  }
  local_298 = local_208;
  local_2a0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc08);
  local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffc08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffc10,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffc08), bVar1) {
    local_2b0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2a0);
    poVar4 = ::std::operator<<((ostream *)local_198,'\n');
    poVar4 = ::std::operator<<(poVar4,(string *)local_2b0);
    ::std::operator<<(poVar4,":\n");
    local_2f0 = local_2b0;
    ::std::function<bool(CLI::App_const*)>::
    function<CLI::Formatter::make_subcommands[abi:cxx11](CLI::App_const*,CLI::AppFormatMode)const::_lambda(CLI::App_const*)_1_,void>
              (in_stack_fffffffffffffc20,(anon_class_8_1_a7fae59f *)in_stack_fffffffffffffc18);
    App::get_subcommands
              ((App *)in_stack_fffffffffffffcf8._M_current,
               (function<bool_(const_CLI::App_*)> *)in_stack_fffffffffffffcf0);
    std::function<bool_(const_CLI::App_*)>::~function((function<bool_(const_CLI::App_*)> *)0x12bcb1)
    ;
    local_2f8 = local_2c8;
    local_300._M_current =
         (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                           (in_stack_fffffffffffffc08);
    in_stack_fffffffffffffcf8 =
         std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                   (in_stack_fffffffffffffc08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                               *)in_stack_fffffffffffffc10,
                              (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                               *)in_stack_fffffffffffffc08), bVar1) {
      ppAVar5 = __gnu_cxx::
                __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                ::operator*(&local_300);
      this_00 = *ppAVar5;
      App::get_name_abi_cxx11_(this_00);
      uVar6 = ::std::__cxx11::string::empty();
      in_stack_fffffffffffffcf0 = this_00;
      if ((uVar6 & 1) == 0) {
        if (local_1c == 1) {
          in_stack_fffffffffffffc10 = local_198;
          psVar7 = App::get_name_abi_cxx11_(this_00);
          ::std::__cxx11::string::string(local_370,(string *)psVar7);
          App::help(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
          ::std::operator<<((ostream *)in_stack_fffffffffffffc10,local_350);
          ::std::__cxx11::string::~string(local_350);
          ::std::__cxx11::string::~string(local_370);
          ::std::operator<<((ostream *)local_198,'\n');
          in_stack_fffffffffffffc18 = this_00;
        }
        else {
          in_stack_fffffffffffffc20 = local_198;
          (**(code **)(*in_RSI + 0x30))(&stack0xfffffffffffffcd0,in_RSI,this_00);
          ::std::operator<<((ostream *)in_stack_fffffffffffffc20,(string *)&stack0xfffffffffffffcd0)
          ;
          ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd0);
          in_stack_fffffffffffffcf0 = this_00;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
      ::operator++(&local_300);
    }
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
              ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
               in_stack_fffffffffffffc20);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_2a0);
  }
  ::std::__cxx11::stringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc20);
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
             in_stack_fffffffffffffc20);
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommands(const App *app, AppFormatMode mode) const {
    std::stringstream out;

    std::vector<const App *> subcommands = app->get_subcommands({});

    // Make a list in definition order of the groups seen
    std::vector<std::string> subcmd_groups_seen;
    for(const App *com : subcommands) {
        if(com->get_name().empty()) {
            if(!com->get_group().empty() && com->get_group().front() != '+') {
                out << make_expanded(com, mode);
            }
            continue;
        }
        std::string group_key = com->get_group();
        if(!group_key.empty() &&
           std::find_if(subcmd_groups_seen.begin(), subcmd_groups_seen.end(), [&group_key](std::string a) {
               return detail::to_lower(a) == detail::to_lower(group_key);
           }) == subcmd_groups_seen.end())
            subcmd_groups_seen.push_back(group_key);
    }

    // For each group, filter out and print subcommands
    for(const std::string &group : subcmd_groups_seen) {
        out << '\n' << group << ":\n";
        std::vector<const App *> subcommands_group = app->get_subcommands(
            [&group](const App *sub_app) { return detail::to_lower(sub_app->get_group()) == detail::to_lower(group); });
        for(const App *new_com : subcommands_group) {
            if(new_com->get_name().empty())
                continue;
            if(mode != AppFormatMode::All) {
                out << make_subcommand(new_com);
            } else {
                out << new_com->help(new_com->get_name(), AppFormatMode::Sub);
                out << '\n';
            }
        }
    }

    return out.str();
}